

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

void __thiscall soul::Value::Value(Value *this,bool v)

{
  PackedData local_58;
  Type local_30;
  byte local_11;
  Value *pVStack_10;
  bool v_local;
  Value *this_local;
  
  local_11 = v;
  pVStack_10 = this;
  Type::Type(&local_30,bool_);
  Value(this,&local_30);
  Type::~Type(&local_30);
  getData(&local_58,this);
  PackedData::setAs<unsigned_char>(&local_58,local_11 & 1);
  return;
}

Assistant:

Value::Value (bool     v)  : Value (Type (PrimitiveType::bool_))     { getData().setAs (v ? (uint8_t) 1 : (uint8_t) 0); }